

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConsumer.cpp
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
Vault::HttpConsumer::del
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Client *client,Url *url)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  optional<Vault::HttpResponse> response;
  string asStack_108 [32];
  string local_e8 [32];
  _Optional_payload_base<Vault::HttpResponse> local_c8;
  _Optional_payload_base<Vault::HttpResponse> local_78;
  
  iVar2 = (*client->_vptr_Client[2])(client);
  if ((char)iVar2 == '\0') {
    (__return_storage_ptr__->
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = false;
  }
  else {
    iVar2 = (*client->_vptr_Client[10])(client);
    (*client->_vptr_Client[8])(local_e8,client);
    (*client->_vptr_Client[9])(asStack_108,client);
    (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x38))
              (&local_c8,(long *)CONCAT44(extraout_var,iVar2),url,local_e8,asStack_108);
    std::__cxx11::string::~string(asStack_108);
    std::__cxx11::string::~string(local_e8);
    std::_Optional_base<Vault::HttpResponse,_false,_false>::_Optional_base
              ((_Optional_base<Vault::HttpResponse,_false,_false> *)&local_78,
               (_Optional_base<Vault::HttpResponse,_false,_false> *)&local_c8);
    bVar1 = HttpClient::is_success((optional<Vault::HttpResponse> *)&local_78);
    std::_Optional_payload_base<Vault::HttpResponse>::_M_reset(&local_78);
    if (bVar1) {
      if (local_c8._M_engaged == false) {
LAB_00195f35:
        std::__throw_bad_optional_access();
      }
      std::_Optional_payload_base<std::__cxx11::string>::
      _Optional_payload_base<std::__cxx11::string_const&>
                ((_Optional_payload_base<std::__cxx11::string> *)__return_storage_ptr__,
                 (undefined1 *)((long)&local_c8._M_payload + 0x28));
    }
    else {
      if (local_c8._M_engaged != false) {
        iVar2 = (*client->_vptr_Client[10])(client);
        if (local_c8._M_engaged == false) goto LAB_00195f35;
        HttpClient::handleResponseError
                  ((HttpClient *)CONCAT44(extraout_var_00,iVar2),(HttpResponse *)&local_c8);
      }
      (__return_storage_ptr__->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false;
    }
    std::_Optional_payload_base<Vault::HttpResponse>::_M_reset(&local_c8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string> Vault::HttpConsumer::del(const Vault::Client &client,
                                                    const Vault::Url &url) {
  if (!client.is_authenticated()) {
    return std::nullopt;
  }

  auto response =
      client.getHttpClient().del(url, client.getToken(), client.getNamespace());

  if (HttpClient::is_success(response)) {
    return {response.value().body.value()};
  }

  if (response) {
    client.getHttpClient().handleResponseError(response.value());
  }

  return std::nullopt;
}